

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

int Granulator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  UInt32 UVar1;
  int iVar2;
  uint index;
  uint uVar3;
  EffectData *data_00;
  bool bVar4;
  float fVar5;
  float fVar6;
  int local_120;
  float local_f0;
  float local_e8;
  float local_e4;
  GranulatorSample *local_e0;
  uint local_cc;
  float s;
  int n_2;
  float *dst;
  Grain *g_end;
  Grain *g;
  uint local_a8;
  float fracpos;
  int n_1;
  float nexteventsample;
  float rate;
  int i_1;
  float a;
  float input;
  int i;
  bool record;
  float *pfStack_80;
  int n;
  float *src;
  GranulatorSample *gs;
  MutexScopeLock mutexScope;
  float *params;
  int usesample;
  float freeze;
  float sampletime;
  int samplerate;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  data_00 = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  UVar1 = (state->field_0).field_0.samplerate;
  fVar5 = data_00->p[5];
  index = (uint)data_00->p[0xc];
  mutexScope.mutex = (Mutex *)data_00;
  MutexScopeLock::MutexScopeLock((MutexScopeLock *)&gs,(Mutex *)sampleMutex,-1 < (int)index);
  (data_00->delay).numchannels = inchannels;
  if ((int)index < 0) {
    local_e0 = &data_00->delay;
  }
  else {
    local_e0 = GetGranulatorSample(index);
  }
  pfStack_80 = inbuffer;
  for (i = 0; (uint)i < length; i = i + 1) {
    bVar4 = false;
    for (a = 0.0; (int)a < inchannels; a = (float)((int)a + 1)) {
      local_e4 = ABS(pfStack_80[(int)a]) + 1e-11;
      if (local_e4 < data_00->env[(int)a] || local_e4 == data_00->env[(int)a]) {
        local_e4 = data_00->env[(int)a] * 0.9995;
      }
      data_00->env[(int)a] = local_e4;
      bVar4 = bVar4 || fVar5 * 2.0 < data_00->env[(int)a];
    }
    if (bVar4) {
      data_00->delaypos = data_00->delaypos + 0x3ffffU & 0x3ffff;
      for (rate = 0.0; (int)rate < inchannels; rate = (float)((int)rate + 1)) {
        (data_00->delay).data[data_00->delaypos * inchannels + (int)rate] = pfStack_80[(int)rate];
        data_00->integrator[(int)rate] =
             data_00->integrator[(int)rate] * 0.9998999834060669 +
             (double)(float)((uint)pfStack_80[(int)rate] & (uint)DAT_00125360);
        (data_00->delay).preview[data_00->delaypos * inchannels + (int)rate] =
             (float)data_00->integrator[(int)rate];
      }
    }
    pfStack_80 = pfStack_80 + inchannels;
  }
  memset(outbuffer,0,(ulong)(length * outchannels) << 2);
  if (((state->field_0).field_0.flags & 6) == 0) {
    if (((state->field_0).field_0.flags & 1) == 0) {
      ResetGrains(data_00);
    }
    else {
      debug_graincount = data_00->activegrains;
      local_e8 = data_00->p[8] * data_00->nextrandtime + data_00->p[7];
      if (local_e8 <= 0.0) {
        local_e8 = 1e+08;
      }
      else {
        local_e8 = (float)(int)UVar1 / local_e8;
      }
      fracpos = local_e8;
      for (local_a8 = 0; local_a8 < length; local_a8 = local_a8 + 1) {
        fVar5 = data_00->samplecounter + 1.0;
        data_00->samplecounter = fVar5;
        if (fracpos <= fVar5) {
          data_00->samplecounter = data_00->samplecounter - fracpos;
          fVar5 = data_00->samplecounter;
          fVar6 = Random::GetFloat(&data_00->random,0.0,1.0);
          data_00->nextrandtime = fVar6;
          local_f0 = data_00->p[8] * data_00->nextrandtime + data_00->p[7];
          if (local_f0 <= 0.0) {
            local_f0 = 1e+08;
          }
          else {
            local_f0 = (float)(int)UVar1 / local_f0;
          }
          fracpos = local_f0;
          if ((data_00->activegrains < 500) && (local_e0->numsamples != 0)) {
            iVar2 = data_00->activegrains;
            data_00->activegrains = iVar2 + 1;
            uVar3 = Random::Get(&data_00->random);
            if ((int)index < 0) {
              local_120 = data_00->delaypos;
            }
            else {
              local_120 = 0;
            }
            Grain::Setup(data_00->grains + iVar2,local_e0,uVar3 % (uint)local_e0->numchannels,
                         &data_00->random,1.0 / (float)(int)UVar1,local_120,
                         (float *)mutexScope.mutex,(float)(int)local_a8 + (1.0 - fVar5),
                         index >> 0x1f);
          }
        }
      }
      g_end = data_00->grains;
      dst = (float *)(data_00->grains + data_00->activegrains);
      while (g_end < dst) {
        _s = outbuffer;
        for (local_cc = 0; local_cc < length; local_cc = local_cc + 1) {
          fVar5 = Grain::Scan(g_end);
          *_s = fVar5 * (1.0 - g_end->pan) + *_s;
          _s[1] = fVar5 * g_end->pan + _s[1];
          _s = _s + outchannels;
        }
        if (g_end->pos < 0.99999) {
          g_end = g_end + 1;
        }
        else {
          dst = dst + -10;
          memcpy(g_end,dst,0x28);
        }
      }
      data_00->activegrains = (int)(((long)dst - (long)data_00->grains) / 0x28);
    }
  }
  MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&gs);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const int samplerate = state->samplerate;
        const float sampletime = 1.0f / (float)samplerate;
        const float freeze = data->p[P_FREEZE] * 2.0f;
        const int usesample = (int)data->p[P_USESAMPLE];
        const float* params = data->p;

        MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);

        data->delay.numchannels = inchannels;

        GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;

        // Fill in live data
        const float* src = inbuffer;
        for (int n = 0; n < length; n++)
        {
            bool record = false;
            for (int i = 0; i < inchannels; i++)
            {
                float input = src[i];
                float a = fabsf(input) + 1.0e-11f;
                data->env[i] = (a > data->env[i]) ? a : (data->env[i] * 0.9995f);
                record |= (data->env[i] > freeze);
            }
            if (record)
            {
                data->delaypos = (data->delaypos + MAXDELAYLENGTH - 1) & (MAXDELAYLENGTH - 1);
                for (int i = 0; i < inchannels; i++)
                {
                    data->delay.data[data->delaypos * inchannels + i] = src[i];

                    // Calculate integrated signal on the fly for better reconstruction in GetFloatBufferCallback.
                    // The small leak of 0.1% prevents build-up of DC.
                    data->integrator[i] = data->integrator[i] * 0.9999f + fabsf(src[i]);
                    data->delay.preview[data->delaypos * inchannels + i] = data->integrator[i];
                }
            }
            src += inchannels;
        }

        memset(outbuffer, 0, length * outchannels * sizeof(float));

        if (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))
            return UNITY_AUDIODSP_OK;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0)
        {
            ResetGrains(data);
            return UNITY_AUDIODSP_OK;
        }

        debug_graincount = data->activegrains;

        // Fill in new grains
        float rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
        float nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
        for (int n = 0; n < length; n++)
        {
            if (++data->samplecounter >= nexteventsample)
            {
                data->samplecounter -= nexteventsample;
                float fracpos = 1.0f - data->samplecounter;
                data->nextrandtime = data->random.GetFloat(0.0f, 1.0f);
                rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
                nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
                if (data->activegrains >= MAXGRAINS || gs->numsamples == 0)
                    continue;
                data->grains[data->activegrains++].Setup(
                    gs,
                    data->random.Get() % gs->numchannels,
                    data->random,
                    sampletime,
                    (usesample >= 0) ? 0 : data->delaypos,
                    params,
                    n + fracpos,
                    usesample < 0
                    );
            }
        }

        // Process grains
        Grain* g = data->grains;
        Grain* g_end = data->grains + data->activegrains;
        while (g < g_end)
        {
            float* dst = outbuffer;
            for (int n = 0; n < length; n++)
            {
                float s = g->Scan();
                dst[0] += s * (1.0f - g->pan);
                dst[1] += s * g->pan;
                dst += outchannels;
            }
            if (g->pos >= 0.99999f)
                *g = *(--g_end);
            else
                ++g;
        }
        data->activegrains = g_end - data->grains;

        return UNITY_AUDIODSP_OK;
    }